

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_free(nk_text_edit *state)

{
  nk_text_edit *state_local;
  
  if (state == (nk_text_edit *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x57d4,"void nk_textedit_free(struct nk_text_edit *)");
  }
  if (state != (nk_text_edit *)0x0) {
    nk_str_free(&state->string);
  }
  return;
}

Assistant:

NK_API void
nk_textedit_free(struct nk_text_edit *state)
{
    NK_ASSERT(state);
    if (!state) return;
    nk_str_free(&state->string);
}